

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::setScene(QGraphicsView *this,QGraphicsScene *scene)

{
  QPointer<QGraphicsScene> *this_00;
  QGraphicsViewPrivate *this_01;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QRectF local_58;
  QObject local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar1 = (this_01->scene).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_01->scene).wp.value;
  }
  if (pQVar3 != &scene->super_QObject) {
    this_00 = &this_01->scene;
    QGraphicsViewPrivate::updateAll(this_01);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      pDVar1 = (this_00->wp).d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this_01->scene).wp.value;
      }
      QObject::disconnect(pQVar3,"2changed(QList<QRectF>)",(QObject *)this,
                          "1updateScene(QList<QRectF>)");
      pDVar1 = (this_00->wp).d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this_01->scene).wp.value;
      }
      QObject::disconnect(pQVar3,"2sceneRectChanged(QRectF)",(QObject *)this,
                          "1updateSceneRect(QRectF)");
      QGraphicsScenePrivate::removeView
                (*(QGraphicsScenePrivate **)((this_01->scene).wp.value + 8),(QGraphicsView *)this);
      this_01->field_0x300 = this_01->field_0x300 & 0xfb;
      bVar2 = QWidget::isActiveWindow((QWidget *)this);
      if ((bVar2) && ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0)) {
        local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_58.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_58,WindowDeactivate);
        pDVar1 = (this_00->wp).d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar3 = (QObject *)0x0;
        }
        else {
          pQVar3 = (this_01->scene).wp.value;
        }
        QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_58);
        QEvent::~QEvent((QEvent *)&local_58);
      }
      bVar2 = QWidget::hasFocus((QWidget *)this);
      if (bVar2) {
        QGraphicsScene::clearFocus((QGraphicsScene *)(this_01->scene).wp.value);
      }
    }
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,&scene->super_QObject);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      pDVar1 = (this_00->wp).d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this_01->scene).wp.value;
      }
      QObject::connect(local_38,(char *)pQVar3,(QObject *)"2sceneRectChanged(QRectF)",(char *)this,
                       0x67a55a);
      QMetaObject::Connection::~Connection((Connection *)local_38);
      this_01->updateSceneSlotReimplementedChecked = false;
      QGraphicsScenePrivate::addView
                (*(QGraphicsScenePrivate **)((this_01->scene).wp.value + 8),(QGraphicsView *)this);
      QGraphicsViewPrivate::recalculateContentSize(this_01);
      sceneRect(&local_58,this);
      (this_01->lastCenterPoint).xp = local_58.w * 0.5 + local_58.xp;
      (this_01->lastCenterPoint).yp = local_58.h * 0.5 + local_58.yp;
      this_01->field_0x300 = this_01->field_0x300 | 0x80;
      uVar4 = *(uint *)(*(long *)((this_01->scene).wp.value + 8) + 0xb8);
      if (((uVar4 >> 0xc & 1) == 0) || ((uVar4 >> 0xd & 1) == 0)) {
        QWidget::setMouseTracking((this_01->super_QAbstractScrollAreaPrivate).viewport,true);
        uVar4 = *(uint *)(*(long *)((this_01->scene).wp.value + 8) + 0xb8);
      }
      if ((uVar4 >> 0x10 & 1) == 0) {
        QWidget::setAttribute
                  ((this_01->super_QAbstractScrollAreaPrivate).viewport,WA_AcceptTouchEvents,true);
      }
      bVar2 = QWidget::isActiveWindow((QWidget *)this);
      if ((bVar2) && ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0)) {
        local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_58.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_58,WindowActivate);
        pDVar1 = (this_00->wp).d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar3 = (QObject *)0x0;
        }
        else {
          pQVar3 = (this_01->scene).wp.value;
        }
        QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_58);
        QEvent::~QEvent((QEvent *)&local_58);
      }
    }
    else {
      QGraphicsViewPrivate::recalculateContentSize(this_01);
    }
    QGraphicsViewPrivate::updateInputMethodSensitivity(this_01);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      bVar2 = QWidget::hasFocus((QWidget *)this);
      if (bVar2) {
        QGraphicsScene::setFocus((QGraphicsScene *)(this_01->scene).wp.value,OtherFocusReason);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setScene(QGraphicsScene *scene)
{
    Q_D(QGraphicsView);
    if (d->scene == scene)
        return;

    // Always update the viewport when the scene changes.
    d->updateAll();

    // Remove the previously assigned scene.
    if (d->scene) {
        disconnect(d->scene, SIGNAL(changed(QList<QRectF>)),
                   this, SLOT(updateScene(QList<QRectF>)));
        disconnect(d->scene, SIGNAL(sceneRectChanged(QRectF)),
                   this, SLOT(updateSceneRect(QRectF)));
        d->scene->d_func()->removeView(this);
        d->connectedToScene = false;

        if (isActiveWindow() && isVisible()) {
            QEvent windowDeactivate(QEvent::WindowDeactivate);
            QCoreApplication::sendEvent(d->scene, &windowDeactivate);
        }
        if (hasFocus())
            d->scene->clearFocus();
    }

    // Assign the new scene and update the contents (scrollbars, etc.)).
    if ((d->scene = scene)) {
        connect(d->scene, SIGNAL(sceneRectChanged(QRectF)),
                this, SLOT(updateSceneRect(QRectF)));
        d->updateSceneSlotReimplementedChecked = false;
        d->scene->d_func()->addView(this);
        d->recalculateContentSize();
        d->lastCenterPoint = sceneRect().center();
        d->keepLastCenterPoint = true;
        // We are only interested in mouse tracking if items accept
        // hover events or use non-default cursors.
        if (!d->scene->d_func()->allItemsIgnoreHoverEvents
            || !d->scene->d_func()->allItemsUseDefaultCursor) {
            d->viewport->setMouseTracking(true);
        }

        // enable touch events if any items is interested in them
        if (!d->scene->d_func()->allItemsIgnoreTouchEvents)
            d->viewport->setAttribute(Qt::WA_AcceptTouchEvents);

        if (isActiveWindow() && isVisible()) {
            QEvent windowActivate(QEvent::WindowActivate);
            QCoreApplication::sendEvent(d->scene, &windowActivate);
        }
    } else {
        d->recalculateContentSize();
    }

    d->updateInputMethodSensitivity();

    if (d->scene && hasFocus())
        d->scene->setFocus();
}